

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bisstemeqblk(bstring b0,void *blk,int len)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -1;
  if ((((b0 != (bstring)0x0) && (puVar1 = b0->data, puVar1 != (uchar *)0x0)) &&
      (-1 < (b0->slen | len) && blk != (void *)0x0)) &&
     ((iVar2 = 0, len <= b0->slen && (iVar2 = 1, 0 < len && puVar1 != (uchar *)blk)))) {
    uVar3 = 0;
    do {
      if (puVar1[uVar3] != *(uchar *)((long)blk + uVar3)) {
        return 0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  return iVar2;
}

Assistant:

int bisstemeqblk (const bstring b0, const void * blk, int len) {
int i;

	if (bdata (b0) == NULL || b0->slen < 0 || NULL == blk || len < 0)
		return BSTR_ERR;
	if (b0->slen < len) return 0;
	if (b0->data == (const unsigned char *) blk || len == 0) return 1;

	for (i = 0; i < len; i ++) {
		if (b0->data[i] != ((const unsigned char *) blk)[i]) return 0;
	}
	return 1;
}